

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile_tests.cpp
# Opt level: O0

void __thiscall
skiwi::anon_unknown_23::primitive_of_2_args_inlined::test(primitive_of_2_args_inlined *this)

{
  allocator<char> local_1381;
  string local_1380;
  string local_1360;
  allocator<char> local_1339;
  string local_1338;
  string local_1318;
  allocator<char> local_12f1;
  string local_12f0;
  string local_12d0;
  allocator<char> local_12a9;
  string local_12a8;
  string local_1288;
  allocator<char> local_1261;
  string local_1260;
  string local_1240;
  allocator<char> local_1219;
  string local_1218;
  string local_11f8;
  allocator<char> local_11d1;
  string local_11d0;
  string local_11b0;
  allocator<char> local_1189;
  string local_1188;
  string local_1168;
  allocator<char> local_1141;
  string local_1140;
  string local_1120;
  allocator<char> local_10f9;
  string local_10f8;
  string local_10d8;
  allocator<char> local_10b1;
  string local_10b0;
  string local_1090;
  allocator<char> local_1069;
  string local_1068;
  string local_1048;
  allocator<char> local_1021;
  string local_1020;
  string local_1000;
  allocator<char> local_fd9;
  string local_fd8;
  string local_fb8;
  allocator<char> local_f91;
  string local_f90;
  string local_f70;
  allocator<char> local_f49;
  string local_f48;
  string local_f28;
  allocator<char> local_f01;
  string local_f00;
  string local_ee0;
  allocator<char> local_eb9;
  string local_eb8;
  string local_e98;
  allocator<char> local_e71;
  string local_e70;
  string local_e50;
  allocator<char> local_e29;
  string local_e28;
  string local_e08;
  allocator<char> local_de1;
  string local_de0;
  string local_dc0;
  allocator<char> local_d99;
  string local_d98;
  string local_d78;
  allocator<char> local_d51;
  string local_d50;
  string local_d30;
  allocator<char> local_d09;
  string local_d08;
  string local_ce8;
  allocator<char> local_cc1;
  string local_cc0;
  string local_ca0;
  allocator<char> local_c79;
  string local_c78;
  string local_c58;
  allocator<char> local_c31;
  string local_c30;
  string local_c10;
  allocator<char> local_be9;
  string local_be8;
  string local_bc8;
  allocator<char> local_ba1;
  string local_ba0;
  string local_b80;
  allocator<char> local_b59;
  string local_b58;
  string local_b38;
  allocator<char> local_b11;
  string local_b10;
  string local_af0;
  allocator<char> local_ac9;
  string local_ac8;
  string local_aa8;
  allocator<char> local_a81;
  string local_a80;
  string local_a60;
  allocator<char> local_a39;
  string local_a38;
  string local_a18;
  allocator<char> local_9f1;
  string local_9f0;
  string local_9d0;
  allocator<char> local_9a9;
  string local_9a8;
  string local_988;
  allocator<char> local_961;
  string local_960;
  string local_940;
  allocator<char> local_919;
  string local_918;
  string local_8f8;
  allocator<char> local_8d1;
  string local_8d0;
  string local_8b0;
  allocator<char> local_889;
  string local_888;
  string local_868;
  allocator<char> local_841;
  string local_840;
  string local_820;
  allocator<char> local_7f9;
  string local_7f8;
  string local_7d8;
  allocator<char> local_7b1;
  string local_7b0;
  string local_790;
  allocator<char> local_769;
  string local_768;
  string local_748;
  allocator<char> local_721;
  string local_720;
  string local_700;
  allocator<char> local_6d9;
  string local_6d8;
  string local_6b8;
  allocator<char> local_691;
  string local_690;
  string local_670;
  allocator<char> local_649;
  string local_648;
  string local_628;
  allocator<char> local_601;
  string local_600;
  string local_5e0;
  allocator<char> local_5b9;
  string local_5b8;
  string local_598;
  allocator<char> local_571;
  string local_570;
  string local_550;
  allocator<char> local_529;
  string local_528;
  string local_508;
  allocator<char> local_4e1;
  string local_4e0;
  string local_4c0;
  allocator<char> local_499;
  string local_498;
  string local_478;
  allocator<char> local_451;
  string local_450;
  string local_430;
  allocator<char> local_409;
  string local_408;
  string local_3e8;
  allocator<char> local_3c1;
  string local_3c0;
  string local_3a0;
  allocator<char> local_379;
  string local_378;
  string local_358;
  allocator<char> local_331;
  string local_330;
  string local_310;
  allocator<char> local_2e9;
  string local_2e8;
  string local_2c8;
  allocator<char> local_2a1;
  string local_2a0;
  string local_280;
  allocator<char> local_259;
  string local_258;
  string local_238;
  allocator<char> local_211;
  string local_210;
  string local_1f0;
  allocator<char> local_1c9;
  string local_1c8;
  string local_1a8;
  allocator<char> local_181;
  string local_180;
  string local_160;
  allocator<char> local_139;
  string local_138;
  string local_118;
  allocator<char> local_f1;
  string local_f0;
  string local_d0;
  allocator<char> local_a9;
  string local_a8;
  string local_88;
  allocator<char> local_51;
  string local_50;
  string local_30;
  primitive_of_2_args_inlined *local_10;
  primitive_of_2_args_inlined *this_local;
  
  local_10 = this;
  compile_fixture::build_string_to_symbol(&this->super_compile_fixture);
  (this->super_compile_fixture).field_0x20 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"(+ 3 2)",&local_51);
  compile_fixture::run(&local_30,&this->super_compile_fixture,&local_50,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("5",&local_30,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xae9,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"(+ 3.2 2)",&local_a9);
  compile_fixture::run(&local_88,&this->super_compile_fixture,&local_a8,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("5.2",&local_88,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xaea,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator(&local_a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,"(+ 3.2 2.3)",&local_f1);
  compile_fixture::run(&local_d0,&this->super_compile_fixture,&local_f0,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("5.5",&local_d0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xaeb,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::allocator<char>::~allocator(&local_f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_138,"(+ 3 2.1)",&local_139);
  compile_fixture::run(&local_118,&this->super_compile_fixture,&local_138,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("5.1",&local_118,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xaec,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_138);
  std::allocator<char>::~allocator(&local_139);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_180,"(- 3 2)",&local_181);
  compile_fixture::run(&local_160,&this->super_compile_fixture,&local_180,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("1",&local_160,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xaee,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  std::__cxx11::string::~string((string *)&local_160);
  std::__cxx11::string::~string((string *)&local_180);
  std::allocator<char>::~allocator(&local_181);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c8,"(- 3.2 2)",&local_1c9);
  compile_fixture::run(&local_1a8,&this->super_compile_fixture,&local_1c8,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("1.2",&local_1a8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xaef,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  std::__cxx11::string::~string((string *)&local_1a8);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::allocator<char>::~allocator(&local_1c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_210,"(- 3.2 2.3)",&local_211);
  compile_fixture::run(&local_1f0,&this->super_compile_fixture,&local_210,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("0.9",&local_1f0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xaf0,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_210);
  std::allocator<char>::~allocator(&local_211);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_258,"(- 3 2.1)",&local_259);
  compile_fixture::run(&local_238,&this->super_compile_fixture,&local_258,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("0.9",&local_238,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xaf1,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  std::__cxx11::string::~string((string *)&local_238);
  std::__cxx11::string::~string((string *)&local_258);
  std::allocator<char>::~allocator(&local_259);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a0,"(* 3 2)",&local_2a1);
  compile_fixture::run(&local_280,&this->super_compile_fixture,&local_2a0,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("6",&local_280,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xaf3,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  std::__cxx11::string::~string((string *)&local_280);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::allocator<char>::~allocator(&local_2a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2e8,"(* 3.2 2)",&local_2e9);
  compile_fixture::run(&local_2c8,&this->super_compile_fixture,&local_2e8,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("6.4",&local_2c8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xaf4,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  std::__cxx11::string::~string((string *)&local_2c8);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::allocator<char>::~allocator(&local_2e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_330,"(* 3.0 2.3)",&local_331);
  compile_fixture::run(&local_310,&this->super_compile_fixture,&local_330,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("6.9",&local_310,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xaf5,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  std::__cxx11::string::~string((string *)&local_310);
  std::__cxx11::string::~string((string *)&local_330);
  std::allocator<char>::~allocator(&local_331);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_378,"(* 3 2.1)",&local_379);
  compile_fixture::run(&local_358,&this->super_compile_fixture,&local_378,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("6.3",&local_358,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xaf6,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  std::__cxx11::string::~string((string *)&local_358);
  std::__cxx11::string::~string((string *)&local_378);
  std::allocator<char>::~allocator(&local_379);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3c0,"(/ 8 2)",&local_3c1);
  compile_fixture::run(&local_3a0,&this->super_compile_fixture,&local_3c0,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("4",&local_3a0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xaf8,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  std::__cxx11::string::~string((string *)&local_3a0);
  std::__cxx11::string::~string((string *)&local_3c0);
  std::allocator<char>::~allocator(&local_3c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_408,"(/ 3.2 2)",&local_409);
  compile_fixture::run(&local_3e8,&this->super_compile_fixture,&local_408,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("1.6",&local_3e8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xaf9,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  std::__cxx11::string::~string((string *)&local_3e8);
  std::__cxx11::string::~string((string *)&local_408);
  std::allocator<char>::~allocator(&local_409);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_450,"(/ 3.0 2.0)",&local_451);
  compile_fixture::run(&local_430,&this->super_compile_fixture,&local_450,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("1.5",&local_430,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xafa,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  std::__cxx11::string::~string((string *)&local_430);
  std::__cxx11::string::~string((string *)&local_450);
  std::allocator<char>::~allocator(&local_451);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_498,"(/ 3 2.0)",&local_499);
  compile_fixture::run(&local_478,&this->super_compile_fixture,&local_498,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("1.5",&local_478,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xafb,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  std::__cxx11::string::~string((string *)&local_478);
  std::__cxx11::string::~string((string *)&local_498);
  std::allocator<char>::~allocator(&local_499);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4e0,"(< 3 2.1)",&local_4e1);
  compile_fixture::run(&local_4c0,&this->super_compile_fixture,&local_4e0,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("#f",&local_4c0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xafd,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  std::__cxx11::string::~string((string *)&local_4c0);
  std::__cxx11::string::~string((string *)&local_4e0);
  std::allocator<char>::~allocator(&local_4e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_528,"(< 3.1 8)",&local_529);
  compile_fixture::run(&local_508,&this->super_compile_fixture,&local_528,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_508,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xafe,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  std::__cxx11::string::~string((string *)&local_508);
  std::__cxx11::string::~string((string *)&local_528);
  std::allocator<char>::~allocator(&local_529);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_570,"(< 3.2 2.1)",&local_571);
  compile_fixture::run(&local_550,&this->super_compile_fixture,&local_570,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("#f",&local_550,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xaff,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  std::__cxx11::string::~string((string *)&local_550);
  std::__cxx11::string::~string((string *)&local_570);
  std::allocator<char>::~allocator(&local_571);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_5b8,"(< 1 21)",&local_5b9);
  compile_fixture::run(&local_598,&this->super_compile_fixture,&local_5b8,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_598,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xb00,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  std::__cxx11::string::~string((string *)&local_598);
  std::__cxx11::string::~string((string *)&local_5b8);
  std::allocator<char>::~allocator(&local_5b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_600,"(<= 3 2.1)",&local_601);
  compile_fixture::run(&local_5e0,&this->super_compile_fixture,&local_600,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("#f",&local_5e0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xb02,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  std::__cxx11::string::~string((string *)&local_5e0);
  std::__cxx11::string::~string((string *)&local_600);
  std::allocator<char>::~allocator(&local_601);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_648,"(<= 3.1 8)",&local_649);
  compile_fixture::run(&local_628,&this->super_compile_fixture,&local_648,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_628,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xb03,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  std::__cxx11::string::~string((string *)&local_628);
  std::__cxx11::string::~string((string *)&local_648);
  std::allocator<char>::~allocator(&local_649);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_690,"(<= 3.2 2.1)",&local_691)
  ;
  compile_fixture::run(&local_670,&this->super_compile_fixture,&local_690,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("#f",&local_670,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xb04,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  std::__cxx11::string::~string((string *)&local_670);
  std::__cxx11::string::~string((string *)&local_690);
  std::allocator<char>::~allocator(&local_691);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_6d8,"(<= 1 21)",&local_6d9);
  compile_fixture::run(&local_6b8,&this->super_compile_fixture,&local_6d8,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_6b8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xb05,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  std::__cxx11::string::~string((string *)&local_6b8);
  std::__cxx11::string::~string((string *)&local_6d8);
  std::allocator<char>::~allocator(&local_6d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_720,"(<= 2 2.0)",&local_721);
  compile_fixture::run(&local_700,&this->super_compile_fixture,&local_720,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_700,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xb06,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  std::__cxx11::string::~string((string *)&local_700);
  std::__cxx11::string::~string((string *)&local_720);
  std::allocator<char>::~allocator(&local_721);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_768,"(<= 3.0 3)",&local_769);
  compile_fixture::run(&local_748,&this->super_compile_fixture,&local_768,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_748,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xb07,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  std::__cxx11::string::~string((string *)&local_748);
  std::__cxx11::string::~string((string *)&local_768);
  std::allocator<char>::~allocator(&local_769);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_7b0,"(<= 3.2 3.2)",&local_7b1)
  ;
  compile_fixture::run(&local_790,&this->super_compile_fixture,&local_7b0,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_790,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xb08,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  std::__cxx11::string::~string((string *)&local_790);
  std::__cxx11::string::~string((string *)&local_7b0);
  std::allocator<char>::~allocator(&local_7b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_7f8,"(<= 1 1)",&local_7f9);
  compile_fixture::run(&local_7d8,&this->super_compile_fixture,&local_7f8,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_7d8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xb09,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  std::__cxx11::string::~string((string *)&local_7d8);
  std::__cxx11::string::~string((string *)&local_7f8);
  std::allocator<char>::~allocator(&local_7f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_840,"(> 3 2.1)",&local_841);
  compile_fixture::run(&local_820,&this->super_compile_fixture,&local_840,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_820,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xb0b,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  std::__cxx11::string::~string((string *)&local_820);
  std::__cxx11::string::~string((string *)&local_840);
  std::allocator<char>::~allocator(&local_841);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_888,"(> 3.1 8)",&local_889);
  compile_fixture::run(&local_868,&this->super_compile_fixture,&local_888,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("#f",&local_868,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xb0c,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  std::__cxx11::string::~string((string *)&local_868);
  std::__cxx11::string::~string((string *)&local_888);
  std::allocator<char>::~allocator(&local_889);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_8d0,"(> 3.2 2.1)",&local_8d1);
  compile_fixture::run(&local_8b0,&this->super_compile_fixture,&local_8d0,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_8b0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xb0d,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  std::__cxx11::string::~string((string *)&local_8b0);
  std::__cxx11::string::~string((string *)&local_8d0);
  std::allocator<char>::~allocator(&local_8d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_918,"(> 1 21)",&local_919);
  compile_fixture::run(&local_8f8,&this->super_compile_fixture,&local_918,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("#f",&local_8f8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xb0e,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  std::__cxx11::string::~string((string *)&local_8f8);
  std::__cxx11::string::~string((string *)&local_918);
  std::allocator<char>::~allocator(&local_919);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_960,"(>= 3 2.1)",&local_961);
  compile_fixture::run(&local_940,&this->super_compile_fixture,&local_960,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_940,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xb10,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  std::__cxx11::string::~string((string *)&local_940);
  std::__cxx11::string::~string((string *)&local_960);
  std::allocator<char>::~allocator(&local_961);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_9a8,"(>= 3.1 8)",&local_9a9);
  compile_fixture::run(&local_988,&this->super_compile_fixture,&local_9a8,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("#f",&local_988,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xb11,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  std::__cxx11::string::~string((string *)&local_988);
  std::__cxx11::string::~string((string *)&local_9a8);
  std::allocator<char>::~allocator(&local_9a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_9f0,"(>= 3.2 2.1)",&local_9f1)
  ;
  compile_fixture::run(&local_9d0,&this->super_compile_fixture,&local_9f0,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_9d0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xb12,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  std::__cxx11::string::~string((string *)&local_9d0);
  std::__cxx11::string::~string((string *)&local_9f0);
  std::allocator<char>::~allocator(&local_9f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a38,"(>= 1 21)",&local_a39);
  compile_fixture::run(&local_a18,&this->super_compile_fixture,&local_a38,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("#f",&local_a18,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xb13,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  std::__cxx11::string::~string((string *)&local_a18);
  std::__cxx11::string::~string((string *)&local_a38);
  std::allocator<char>::~allocator(&local_a39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a80,"(>= 2 2.0)",&local_a81);
  compile_fixture::run(&local_a60,&this->super_compile_fixture,&local_a80,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_a60,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xb14,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  std::__cxx11::string::~string((string *)&local_a60);
  std::__cxx11::string::~string((string *)&local_a80);
  std::allocator<char>::~allocator(&local_a81);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_ac8,"(>= 3.0 3)",&local_ac9);
  compile_fixture::run(&local_aa8,&this->super_compile_fixture,&local_ac8,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_aa8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xb15,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  std::__cxx11::string::~string((string *)&local_aa8);
  std::__cxx11::string::~string((string *)&local_ac8);
  std::allocator<char>::~allocator(&local_ac9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b10,"(>= 3.2 3.2)",&local_b11)
  ;
  compile_fixture::run(&local_af0,&this->super_compile_fixture,&local_b10,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_af0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xb16,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  std::__cxx11::string::~string((string *)&local_af0);
  std::__cxx11::string::~string((string *)&local_b10);
  std::allocator<char>::~allocator(&local_b11);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b58,"(>= 1 1)",&local_b59);
  compile_fixture::run(&local_b38,&this->super_compile_fixture,&local_b58,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_b38,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xb17,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  std::__cxx11::string::~string((string *)&local_b38);
  std::__cxx11::string::~string((string *)&local_b58);
  std::allocator<char>::~allocator(&local_b59);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_ba0,"(= 12 13)",&local_ba1);
  compile_fixture::run(&local_b80,&this->super_compile_fixture,&local_ba0,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("#f",&local_b80,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xb19,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  std::__cxx11::string::~string((string *)&local_b80);
  std::__cxx11::string::~string((string *)&local_ba0);
  std::allocator<char>::~allocator(&local_ba1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_be8,"(= 12 12)",&local_be9);
  compile_fixture::run(&local_bc8,&this->super_compile_fixture,&local_be8,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_bc8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xb1a,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  std::__cxx11::string::~string((string *)&local_bc8);
  std::__cxx11::string::~string((string *)&local_be8);
  std::allocator<char>::~allocator(&local_be9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c30,"(= 12.1 13.1)",&local_c31);
  compile_fixture::run(&local_c10,&this->super_compile_fixture,&local_c30,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("#f",&local_c10,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xb1b,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  std::__cxx11::string::~string((string *)&local_c10);
  std::__cxx11::string::~string((string *)&local_c30);
  std::allocator<char>::~allocator(&local_c31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c78,"(= 12.1 12.1)",&local_c79);
  compile_fixture::run(&local_c58,&this->super_compile_fixture,&local_c78,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_c58,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xb1c,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  std::__cxx11::string::~string((string *)&local_c58);
  std::__cxx11::string::~string((string *)&local_c78);
  std::allocator<char>::~allocator(&local_c79);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_cc0,"(= 12 13.1)",&local_cc1);
  compile_fixture::run(&local_ca0,&this->super_compile_fixture,&local_cc0,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("#f",&local_ca0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xb1d,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  std::__cxx11::string::~string((string *)&local_ca0);
  std::__cxx11::string::~string((string *)&local_cc0);
  std::allocator<char>::~allocator(&local_cc1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d08,"(= 12 12.0)",&local_d09);
  compile_fixture::run(&local_ce8,&this->super_compile_fixture,&local_d08,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_ce8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xb1e,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  std::__cxx11::string::~string((string *)&local_ce8);
  std::__cxx11::string::~string((string *)&local_d08);
  std::allocator<char>::~allocator(&local_d09);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d50,"(= 12.0 13)",&local_d51);
  compile_fixture::run(&local_d30,&this->super_compile_fixture,&local_d50,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("#f",&local_d30,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xb1f,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  std::__cxx11::string::~string((string *)&local_d30);
  std::__cxx11::string::~string((string *)&local_d50);
  std::allocator<char>::~allocator(&local_d51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d98,"(= 12.0 12)",&local_d99);
  compile_fixture::run(&local_d78,&this->super_compile_fixture,&local_d98,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_d78,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xb20,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  std::__cxx11::string::~string((string *)&local_d78);
  std::__cxx11::string::~string((string *)&local_d98);
  std::allocator<char>::~allocator(&local_d99);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_de0,"(!= 12 13)",&local_de1);
  compile_fixture::run(&local_dc0,&this->super_compile_fixture,&local_de0,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_dc0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xb22,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  std::__cxx11::string::~string((string *)&local_dc0);
  std::__cxx11::string::~string((string *)&local_de0);
  std::allocator<char>::~allocator(&local_de1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e28,"(!= 12 12)",&local_e29);
  compile_fixture::run(&local_e08,&this->super_compile_fixture,&local_e28,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("#f",&local_e08,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xb23,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  std::__cxx11::string::~string((string *)&local_e08);
  std::__cxx11::string::~string((string *)&local_e28);
  std::allocator<char>::~allocator(&local_e29);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e70,"(!= 12.1 13.1)",&local_e71);
  compile_fixture::run(&local_e50,&this->super_compile_fixture,&local_e70,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_e50,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xb24,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  std::__cxx11::string::~string((string *)&local_e50);
  std::__cxx11::string::~string((string *)&local_e70);
  std::allocator<char>::~allocator(&local_e71);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_eb8,"(!= 12.1 12.1)",&local_eb9);
  compile_fixture::run(&local_e98,&this->super_compile_fixture,&local_eb8,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("#f",&local_e98,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xb25,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  std::__cxx11::string::~string((string *)&local_e98);
  std::__cxx11::string::~string((string *)&local_eb8);
  std::allocator<char>::~allocator(&local_eb9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f00,"(!= 12 13.1)",&local_f01)
  ;
  compile_fixture::run(&local_ee0,&this->super_compile_fixture,&local_f00,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_ee0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xb26,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  std::__cxx11::string::~string((string *)&local_ee0);
  std::__cxx11::string::~string((string *)&local_f00);
  std::allocator<char>::~allocator(&local_f01);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f48,"(!= 12 12.0)",&local_f49)
  ;
  compile_fixture::run(&local_f28,&this->super_compile_fixture,&local_f48,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("#f",&local_f28,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xb27,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  std::__cxx11::string::~string((string *)&local_f28);
  std::__cxx11::string::~string((string *)&local_f48);
  std::allocator<char>::~allocator(&local_f49);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f90,"(!= 12.0 13)",&local_f91)
  ;
  compile_fixture::run(&local_f70,&this->super_compile_fixture,&local_f90,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_f70,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xb28,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  std::__cxx11::string::~string((string *)&local_f70);
  std::__cxx11::string::~string((string *)&local_f90);
  std::allocator<char>::~allocator(&local_f91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_fd8,"(!= 12.0 12)",&local_fd9)
  ;
  compile_fixture::run(&local_fb8,&this->super_compile_fixture,&local_fd8,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("#f",&local_fb8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xb29,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  std::__cxx11::string::~string((string *)&local_fb8);
  std::__cxx11::string::~string((string *)&local_fd8);
  std::allocator<char>::~allocator(&local_fd9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1020,"(eq? \'foo \'bar) ",&local_1021);
  compile_fixture::run(&local_1000,&this->super_compile_fixture,&local_1020,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("#f",&local_1000,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xb2b,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  std::__cxx11::string::~string((string *)&local_1000);
  std::__cxx11::string::~string((string *)&local_1020);
  std::allocator<char>::~allocator(&local_1021);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1068,"(eq? \'foo \'foo) ",&local_1069);
  compile_fixture::run(&local_1048,&this->super_compile_fixture,&local_1068,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_1048,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xb2c,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  std::__cxx11::string::~string((string *)&local_1048);
  std::__cxx11::string::~string((string *)&local_1068);
  std::allocator<char>::~allocator(&local_1069);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_10b0,"(+)",&local_10b1);
  compile_fixture::run(&local_1090,&this->super_compile_fixture,&local_10b0,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("0",&local_1090,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xb2e,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  std::__cxx11::string::~string((string *)&local_1090);
  std::__cxx11::string::~string((string *)&local_10b0);
  std::allocator<char>::~allocator(&local_10b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_10f8,"(*)",&local_10f9);
  compile_fixture::run(&local_10d8,&this->super_compile_fixture,&local_10f8,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("1",&local_10d8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xb2f,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  std::__cxx11::string::~string((string *)&local_10d8);
  std::__cxx11::string::~string((string *)&local_10f8);
  std::allocator<char>::~allocator(&local_10f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1140,"(-)",&local_1141);
  compile_fixture::run(&local_1120,&this->super_compile_fixture,&local_1140,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("0",&local_1120,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xb30,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  std::__cxx11::string::~string((string *)&local_1120);
  std::__cxx11::string::~string((string *)&local_1140);
  std::allocator<char>::~allocator(&local_1141);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1188,"(/)",&local_1189);
  compile_fixture::run(&local_1168,&this->super_compile_fixture,&local_1188,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("1",&local_1168,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xb31,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  std::__cxx11::string::~string((string *)&local_1168);
  std::__cxx11::string::~string((string *)&local_1188);
  std::allocator<char>::~allocator(&local_1189);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_11d0,"(+ 3)",&local_11d1);
  compile_fixture::run(&local_11b0,&this->super_compile_fixture,&local_11d0,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("3",&local_11b0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xb32,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  std::__cxx11::string::~string((string *)&local_11b0);
  std::__cxx11::string::~string((string *)&local_11d0);
  std::allocator<char>::~allocator(&local_11d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1218,"(- 3)",&local_1219);
  compile_fixture::run(&local_11f8,&this->super_compile_fixture,&local_1218,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("-3",&local_11f8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xb33,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  std::__cxx11::string::~string((string *)&local_11f8);
  std::__cxx11::string::~string((string *)&local_1218);
  std::allocator<char>::~allocator(&local_1219);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1260,"(* 5)",&local_1261);
  compile_fixture::run(&local_1240,&this->super_compile_fixture,&local_1260,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("5",&local_1240,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xb34,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  std::__cxx11::string::~string((string *)&local_1240);
  std::__cxx11::string::~string((string *)&local_1260);
  std::allocator<char>::~allocator(&local_1261);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_12a8,"(/ 1 5)",&local_12a9);
  compile_fixture::run(&local_1288,&this->super_compile_fixture,&local_12a8,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("0.2",&local_1288,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xb35,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  std::__cxx11::string::~string((string *)&local_1288);
  std::__cxx11::string::~string((string *)&local_12a8);
  std::allocator<char>::~allocator(&local_12a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_12f0,"(/ 1 5 2)",&local_12f1);
  compile_fixture::run(&local_12d0,&this->super_compile_fixture,&local_12f0,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("0.1",&local_12d0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xb36,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  std::__cxx11::string::~string((string *)&local_12d0);
  std::__cxx11::string::~string((string *)&local_12f0);
  std::allocator<char>::~allocator(&local_12f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1338,"(/ 5)",&local_1339);
  compile_fixture::run(&local_1318,&this->super_compile_fixture,&local_1338,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("0.2",&local_1318,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xb37,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  std::__cxx11::string::~string((string *)&local_1318);
  std::__cxx11::string::~string((string *)&local_1338);
  std::allocator<char>::~allocator(&local_1339);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1380,"(/ 5.0)",&local_1381);
  compile_fixture::run(&local_1360,&this->super_compile_fixture,&local_1380,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("0.2",&local_1360,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xb38,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  std::__cxx11::string::~string((string *)&local_1360);
  std::__cxx11::string::~string((string *)&local_1380);
  std::allocator<char>::~allocator(&local_1381);
  return;
}

Assistant:

void test()
      {
      build_string_to_symbol();
      ops.primitives_inlined = true;
      TEST_EQ("5", run("(+ 3 2)"));
      TEST_EQ("5.2", run("(+ 3.2 2)"));
      TEST_EQ("5.5", run("(+ 3.2 2.3)"));
      TEST_EQ("5.1", run("(+ 3 2.1)"));

      TEST_EQ("1", run("(- 3 2)"));
      TEST_EQ("1.2", run("(- 3.2 2)"));
      TEST_EQ("0.9", run("(- 3.2 2.3)"));
      TEST_EQ("0.9", run("(- 3 2.1)"));

      TEST_EQ("6", run("(* 3 2)"));
      TEST_EQ("6.4", run("(* 3.2 2)"));
      TEST_EQ("6.9", run("(* 3.0 2.3)"));
      TEST_EQ("6.3", run("(* 3 2.1)"));

      TEST_EQ("4", run("(/ 8 2)"));
      TEST_EQ("1.6", run("(/ 3.2 2)"));
      TEST_EQ("1.5", run("(/ 3.0 2.0)"));
      TEST_EQ("1.5", run("(/ 3 2.0)"));

      TEST_EQ("#f", run("(< 3 2.1)"));
      TEST_EQ("#t", run("(< 3.1 8)"));
      TEST_EQ("#f", run("(< 3.2 2.1)"));
      TEST_EQ("#t", run("(< 1 21)"));

      TEST_EQ("#f", run("(<= 3 2.1)"));
      TEST_EQ("#t", run("(<= 3.1 8)"));
      TEST_EQ("#f", run("(<= 3.2 2.1)"));
      TEST_EQ("#t", run("(<= 1 21)"));
      TEST_EQ("#t", run("(<= 2 2.0)"));
      TEST_EQ("#t", run("(<= 3.0 3)"));
      TEST_EQ("#t", run("(<= 3.2 3.2)"));
      TEST_EQ("#t", run("(<= 1 1)"));

      TEST_EQ("#t", run("(> 3 2.1)"));
      TEST_EQ("#f", run("(> 3.1 8)"));
      TEST_EQ("#t", run("(> 3.2 2.1)"));
      TEST_EQ("#f", run("(> 1 21)"));

      TEST_EQ("#t", run("(>= 3 2.1)"));
      TEST_EQ("#f", run("(>= 3.1 8)"));
      TEST_EQ("#t", run("(>= 3.2 2.1)"));
      TEST_EQ("#f", run("(>= 1 21)"));
      TEST_EQ("#t", run("(>= 2 2.0)"));
      TEST_EQ("#t", run("(>= 3.0 3)"));
      TEST_EQ("#t", run("(>= 3.2 3.2)"));
      TEST_EQ("#t", run("(>= 1 1)"));

      TEST_EQ("#f", run("(= 12 13)"));
      TEST_EQ("#t", run("(= 12 12)"));
      TEST_EQ("#f", run("(= 12.1 13.1)"));
      TEST_EQ("#t", run("(= 12.1 12.1)"));
      TEST_EQ("#f", run("(= 12 13.1)"));
      TEST_EQ("#t", run("(= 12 12.0)"));
      TEST_EQ("#f", run("(= 12.0 13)"));
      TEST_EQ("#t", run("(= 12.0 12)"));

      TEST_EQ("#t", run("(!= 12 13)"));
      TEST_EQ("#f", run("(!= 12 12)"));
      TEST_EQ("#t", run("(!= 12.1 13.1)"));
      TEST_EQ("#f", run("(!= 12.1 12.1)"));
      TEST_EQ("#t", run("(!= 12 13.1)"));
      TEST_EQ("#f", run("(!= 12 12.0)"));
      TEST_EQ("#t", run("(!= 12.0 13)"));
      TEST_EQ("#f", run("(!= 12.0 12)"));

      TEST_EQ("#f", run("(eq? 'foo 'bar) "));
      TEST_EQ("#t", run("(eq? 'foo 'foo) "));

      TEST_EQ("0", run("(+)"));
      TEST_EQ("1", run("(*)"));
      TEST_EQ("0", run("(-)"));
      TEST_EQ("1", run("(/)"));
      TEST_EQ("3", run("(+ 3)"));
      TEST_EQ("-3", run("(- 3)"));
      TEST_EQ("5", run("(* 5)"));
      TEST_EQ("0.2", run("(/ 1 5)"));
      TEST_EQ("0.1", run("(/ 1 5 2)"));
      TEST_EQ("0.2", run("(/ 5)"));
      TEST_EQ("0.2", run("(/ 5.0)"));
      }